

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O1

bool __thiscall
cmStringCommand::RegexMatchAll
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pcVar3;
  cmMakefile *this_00;
  undefined4 uVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  undefined7 extraout_var;
  long *plVar8;
  size_type *psVar9;
  byte bVar10;
  char *pcVar11;
  _Alloc_hider string;
  string e_1;
  string output;
  string input;
  string regex;
  string outvar;
  RegularExpression re;
  string local_1f0;
  undefined1 local_1d0 [36];
  undefined4 local_1ac;
  string local_1a8;
  char *local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  char *local_120;
  undefined8 local_118;
  char local_110;
  undefined7 uStack_10f;
  RegularExpression local_100;
  
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  pcVar3 = pbVar2[2]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_180,pcVar3,pcVar3 + pbVar2[2]._M_string_length);
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  pcVar3 = pbVar2[3]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_160,pcVar3,pcVar3 + pbVar2[3]._M_string_length);
  cmMakefile::ClearMatches((this->super_cmCommand).Makefile);
  local_100.program = (char *)0x0;
  bVar7 = cmsys::RegularExpression::compile(&local_100,local_180._M_dataplus._M_p);
  if (bVar7) {
    local_1d0._8_8_ =
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_1d0._0_8_ =
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start + 4;
    local_118 = 0;
    local_110 = '\0';
    local_120 = &local_110;
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&local_1a8,
               (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)local_1d0,&local_110);
    if (local_120 != &local_110) {
      operator_delete(local_120,CONCAT71(uStack_10f,local_110) + 1);
    }
    local_1d0._0_8_ = local_1d0 + 0x10;
    local_1d0._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_1d0[0x10] = '\0';
    paVar1 = &local_1f0.field_2;
    string._M_p = local_1a8._M_dataplus._M_p;
    do {
      bVar7 = cmsys::RegularExpression::find(&local_100,string._M_p);
      this_00 = (this->super_cmCommand).Makefile;
      local_1ac = (undefined4)CONCAT71(extraout_var,bVar7);
      if (!bVar7) {
        cmMakefile::AddDefinition(this_00,&local_160,(char *)local_1d0._0_8_);
        break;
      }
      cmMakefile::StoreMatches(this_00,&local_100);
      pcVar6 = local_100.searchstring;
      pcVar5 = local_100.endp[0];
      local_188 = local_100.startp[0];
      if (local_100.endp[0] == local_100.startp[0]) {
        std::operator+(&local_140,"sub-command REGEX, mode MATCHALL regex \"",&local_180);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_140);
        psVar9 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_1f0.field_2._M_allocated_capacity = *psVar9;
          local_1f0.field_2._8_8_ = plVar8[3];
          local_1f0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_1f0.field_2._M_allocated_capacity = *psVar9;
          local_1f0._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_1f0._M_string_length = plVar8[1];
        *plVar8 = (long)psVar9;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
        }
        cmCommand::SetError(&this->super_cmCommand,&local_1f0);
      }
      else {
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0._8_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::__cxx11::string::append(local_1d0);
        }
        pcVar11 = string._M_p + ((long)local_188 - (long)pcVar6);
        string._M_p = string._M_p + ((long)pcVar5 - (long)pcVar6);
        local_1f0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,pcVar11,string._M_p);
        std::__cxx11::string::_M_append(local_1d0,(ulong)local_1f0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
    } while (pcVar5 != local_188);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1d0 + 0x10)) {
      operator_delete((void *)local_1d0._0_8_,CONCAT71(local_1d0._17_7_,local_1d0[0x10]) + 1);
    }
    uVar4 = local_1ac;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    bVar10 = (byte)uVar4 ^ 1;
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                   "sub-command REGEX, mode MATCHALL failed to compile regex \"",&local_180);
    plVar8 = (long *)std::__cxx11::string::append(local_1d0);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_1a8.field_2._M_allocated_capacity = *psVar9;
      local_1a8.field_2._8_8_ = plVar8[3];
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    }
    else {
      local_1a8.field_2._M_allocated_capacity = *psVar9;
      local_1a8._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_1a8._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1d0 + 0x10)) {
      operator_delete((void *)local_1d0._0_8_,CONCAT71(local_1d0._17_7_,local_1d0[0x10]) + 1);
    }
    cmCommand::SetError(&this->super_cmCommand,&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    bVar10 = 0;
  }
  if (local_100.program != (char *)0x0) {
    operator_delete__(local_100.program);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  return (bool)bVar10;
}

Assistant:

bool cmStringCommand::RegexMatchAll(std::vector<std::string> const& args)
{
  //"STRING(REGEX MATCHALL <regular_expression> <output variable> <input>
  // [<input>...])\n";
  std::string regex = args[2];
  std::string outvar = args[3];

  this->Makefile->ClearMatches();
  // Compile the regular expression.
  cmsys::RegularExpression re;
  if(!re.compile(regex.c_str()))
    {
    std::string e =
      "sub-command REGEX, mode MATCHALL failed to compile regex \""+
      regex+"\".";
    this->SetError(e);
    return false;
    }

  // Concatenate all the last arguments together.
  std::string input = cmJoin(cmMakeRange(args).advance(4), std::string());

  // Scan through the input for all matches.
  std::string output;
  const char* p = input.c_str();
  while(re.find(p))
    {
    this->Makefile->StoreMatches(re);
    std::string::size_type l = re.start();
    std::string::size_type r = re.end();
    if(r-l == 0)
      {
      std::string e = "sub-command REGEX, mode MATCHALL regex \""+
        regex+"\" matched an empty string.";
      this->SetError(e);
      return false;
      }
    if(!output.empty())
      {
      output += ";";
      }
    output += std::string(p+l, r-l);
    p += r;
    }

  // Store the output in the provided variable.
  this->Makefile->AddDefinition(outvar, output.c_str());
  return true;
}